

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O3

rb_result_t rb_tree_new_ex(rb_tree *tree,rb_cmp_func_ex_t compare,void *state)

{
  rb_result_t rVar1;
  undefined8 extraout_RDX;
  
  if (tree == (rb_tree *)0x0) {
    rb_tree_new_ex_cold_2();
  }
  else if (compare != (rb_cmp_func_ex_t)0x0) {
    tree->root = (rb_tree_node *)0x0;
    tree->compare = compare;
    tree->state = state;
    tree->rightmost = (rb_tree_node *)0x0;
    return 0;
  }
  rb_tree_new_ex_cold_1();
  if (tree == (rb_tree *)0x0) {
    rb_tree_new_cold_2();
  }
  else if (compare != (rb_cmp_func_ex_t)0x0) {
    tree->root = (rb_tree_node *)0x0;
    tree->compare = __rb_tree_cmp_mapper;
    tree->state = compare;
    tree->rightmost = (rb_tree_node *)0x0;
    return 0;
  }
  rb_tree_new_cold_1();
  rVar1 = (*(code *)tree)(compare,extraout_RDX);
  return rVar1;
}

Assistant:

rb_result_t rb_tree_new_ex(struct rb_tree *tree,
                           rb_cmp_func_ex_t compare,
                           void *state)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(compare != NULL);

    tree->root = NULL;
    tree->compare = compare;
    tree->state = state;
    tree->rightmost = NULL;

    return ret;
}